

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_uuencode.c
# Opt level: O0

int archive_filter_uuencode_open(archive_write_filter *f)

{
  uint *puVar1;
  archive *paVar2;
  int iVar3;
  archive_string *paVar4;
  long in_RDI;
  int ret;
  size_t bpb;
  size_t bs;
  private_uuencode *state;
  archive_write_filter *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  archive *in_stack_ffffffffffffffd8;
  archive *local_20;
  int local_4;
  
  puVar1 = *(uint **)(in_RDI + 0x40);
  local_20 = (archive *)0x10000;
  local_4 = __archive_write_open_filter(in_stack_ffffffffffffffc8);
  if (local_4 == 0) {
    paVar2 = local_20;
    if (**(int **)(in_RDI + 8) == -0x4f3a3f22) {
      iVar3 = archive_write_get_bytes_per_block(in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffd8 = (archive *)(long)iVar3;
      paVar2 = in_stack_ffffffffffffffd8;
      if ((in_stack_ffffffffffffffd8 < (archive *)0x10001) &&
         (paVar2 = local_20, in_stack_ffffffffffffffd8 != (archive *)0x0)) {
        paVar2 = (archive *)(0x10000 - 0x10000U % (ulong)in_stack_ffffffffffffffd8);
      }
    }
    local_20 = paVar2;
    *(archive **)(puVar1 + 0xe) = local_20;
    paVar4 = archive_string_ensure
                       ((archive_string *)in_stack_ffffffffffffffd8,
                        CONCAT44(local_4,in_stack_ffffffffffffffd0));
    if (paVar4 == (archive_string *)0x0) {
      archive_set_error(*(archive **)(in_RDI + 8),0xc,"Can\'t allocate data for uuencode buffer");
      local_4 = -0x1e;
    }
    else {
      archive_string_sprintf
                ((archive_string *)(puVar1 + 8),"begin %o %s\n",(ulong)*puVar1,
                 *(undefined8 *)(puVar1 + 2));
      *(uint **)(in_RDI + 0x40) = puVar1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int
archive_filter_uuencode_open(struct archive_write_filter *f)
{
	struct private_uuencode *state = (struct private_uuencode *)f->data;
	size_t bs = 65536, bpb;
	int ret;

	ret = __archive_write_open_filter(f->next_filter);
	if (ret != ARCHIVE_OK)
		return (ret);

	if (f->archive->magic == ARCHIVE_WRITE_MAGIC) {
		/* Buffer size should be a multiple number of the of bytes
		 * per block for performance. */
		bpb = archive_write_get_bytes_per_block(f->archive);
		if (bpb > bs)
			bs = bpb;
		else if (bpb != 0)
			bs -= bs % bpb;
	}

	state->bs = bs;
	if (archive_string_ensure(&state->encoded_buff, bs + 512) == NULL) {
		archive_set_error(f->archive, ENOMEM,
		    "Can't allocate data for uuencode buffer");
		return (ARCHIVE_FATAL);
	}

	archive_string_sprintf(&state->encoded_buff, "begin %o %s\n",
	    state->mode, state->name.s);

	f->data = state;
	return (0);
}